

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O0

token * __thiscall dh::scanner::getToken(token *__return_storage_ptr__,scanner *this)

{
  reference other;
  bool local_56;
  allocator local_41;
  string local_40 [32];
  __normal_iterator<dh::token_*,_std::vector<dh::token,_std::allocator<dh::token>_>_> local_20;
  scanner *local_18;
  scanner *this_local;
  token *tmp;
  
  local_56 = true;
  local_18 = this;
  this_local = (scanner *)__return_storage_ptr__;
  if ((this->scanflag & 1U) != 0) {
    local_20._M_current =
         (token *)std::vector<dh::token,_std::allocator<dh::token>_>::end(&this->_tokens);
    local_56 = __gnu_cxx::operator==(&local_20,&this->_it);
  }
  if (local_56 == false) {
    other = __gnu_cxx::
            __normal_iterator<const_dh::token_*,_std::vector<dh::token,_std::allocator<dh::token>_>_>
            ::operator*(&this->_it);
    token::token(__return_storage_ptr__,other);
    __gnu_cxx::
    __normal_iterator<const_dh::token_*,_std::vector<dh::token,_std::allocator<dh::token>_>_>::
    operator++(&this->_it);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    token::token(__return_storage_ptr__,(string *)local_40,NONES,0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

token scanner::getToken()
{
	if ( scanflag == false || _tokens.end() == _it)
	{
		return token( "", TYPE::NONES, 0);
	}

	// use copy constructrue function
	token tmp(*_it);

	// pointer point to next word
	++_it;

	return tmp;
}